

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chainstate.cpp
# Opt level: O2

ChainstateLoadResult *
node::LoadChainstate
          (ChainstateLoadResult *__return_storage_ptr__,ChainstateManager *chainman,
          CacheSizes *cache_sizes,ChainstateLoadOptions *options)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  _Head_base<0UL,_Chainstate_*,_false> _Var4;
  string original;
  string original_00;
  bool bVar5;
  SnapshotCompletionResult SVar6;
  base_blob<256U> *this;
  base_blob<256u> *this_00;
  arith_uint256 *this_01;
  base_uint<256U> *a;
  Chainstate *this_02;
  long in_FS_OFFSET;
  undefined1 auVar7 [16];
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  undefined4 uStack_120;
  ChainstateLoadStatus local_11c;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  ChainstateLoadResult local_108;
  string local_c0 [32];
  ChainstateLoadResult local_a0;
  string local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this = &ChainstateManager::AssumedValidBlock(chainman)->super_base_blob<256U>;
  bVar5 = base_blob<256U>::IsNull(this);
  if (bVar5) {
    logging_function._M_str = "LoadChainstate";
    logging_function._M_len = 0xe;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
    ;
    source_file._M_len = 99;
    LogPrintFormatInternal<>
              (logging_function,source_file,0xa8,ALL,Info,(ConstevalFormatString<0U>)0x68dd1a);
  }
  else {
    this_00 = (base_blob<256u> *)ChainstateManager::AssumedValidBlock(chainman);
    base_blob<256u>::GetHex_abi_cxx11_((string *)&local_a0,this_00);
    logging_function_00._M_str = "LoadChainstate";
    logging_function_00._M_len = 0xe;
    source_file_00._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
    ;
    source_file_00._M_len = 99;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_00,source_file_00,0xa6,ALL,Info,(ConstevalFormatString<1U>)0x68dce3,
               (string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  this_01 = ChainstateManager::MinimumChainWork(chainman);
  base_uint<256u>::GetHex_abi_cxx11_((string *)&local_a0,this_01);
  logging_function_01._M_str = "LoadChainstate";
  logging_function_01._M_len = 0xe;
  source_file_01._M_str =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
  ;
  source_file_01._M_len = 99;
  LogPrintFormatInternal<std::__cxx11::string>
            (logging_function_01,source_file_01,0xaa,ALL,Info,(ConstevalFormatString<1U>)0x68dd41,
             (string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  a = &ChainstateManager::MinimumChainWork(chainman)->super_base_uint<256U>;
  UintToArith256((arith_uint256 *)&local_a0,
                 &(((chainman->m_options).chainparams)->consensus).nMinimumChainWork);
  bVar5 = ::operator<(a,(base_uint<256U> *)&local_a0);
  if (bVar5) {
    base_blob<256u>::GetHex_abi_cxx11_
              ((string *)&local_a0,
               (base_blob<256u> *)
               &(((chainman->m_options).chainparams)->consensus).nMinimumChainWork);
    logging_function_02._M_str = "LoadChainstate";
    logging_function_02._M_len = 0xe;
    source_file_02._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
    ;
    source_file_02._M_len = 99;
    LogPrintFormatInternal<std::__cxx11::string>
              (logging_function_02,source_file_02,0xac,ALL,Info,(ConstevalFormatString<1U>)0x68dd5f,
               (string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  uVar3 = (chainman->m_blockman).m_opts.prune_target;
  if (uVar3 != 0) {
    if (uVar3 == 0xffffffffffffffff) {
      logging_function_03._M_str = "LoadChainstate";
      logging_function_03._M_len = 0xe;
      source_file_03._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
      ;
      source_file_03._M_len = 99;
      LogPrintFormatInternal<>
                (logging_function_03,source_file_03,0xaf,ALL,Info,
                 (ConstevalFormatString<0U>)0x68dd99);
    }
    else {
      local_a0.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_dataplus._M_p = (pointer)(uVar3 >> 0x14);
      logging_function_04._M_str = "LoadChainstate";
      logging_function_04._M_len = 0xe;
      source_file_04._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
      ;
      source_file_04._M_len = 99;
      LogPrintFormatInternal<unsigned_long>
                (logging_function_04,source_file_04,0xb1,ALL,Info,
                 (ConstevalFormatString<1U>)0x68ddff,(unsigned_long *)&local_a0);
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock7,&cs_main,"cs_main",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
             ,0xb4,false);
  uVar1 = cache_sizes->coins_db;
  uVar2 = cache_sizes->coins;
  auVar7._8_4_ = (int)uVar1;
  auVar7._0_8_ = uVar2;
  auVar7._12_4_ = (int)((ulong)uVar1 >> 0x20);
  chainman->m_total_coinstip_cache = uVar2;
  chainman->m_total_coinsdb_cache = auVar7._8_8_;
  ChainstateManager::InitializeChainstate(chainman,options->mempool);
  bVar5 = ChainstateManager::DetectSnapshotChainstate(chainman);
  if ((bVar5) && (options->wipe_chainstate_db == true)) {
    logging_function_05._M_str = "LoadChainstate";
    logging_function_05._M_len = 0xe;
    source_file_05._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
    ;
    source_file_05._M_len = 99;
    LogPrintFormatInternal<>
              (logging_function_05,source_file_05,0xc0,ALL,Info,(ConstevalFormatString<0U>)0x68de44)
    ;
    bVar5 = ChainstateManager::DeleteSnapshotChainstate(chainman);
    if (!bVar5) {
      local_108.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_dataplus._M_p._0_4_ = 2;
      std::__cxx11::string::string<std::allocator<char>>
                (local_58,"Couldn\'t remove snapshot chainstate.",(allocator<char> *)&local_11c);
      original._M_string_length._0_4_ = uStack_120;
      original._M_dataplus._M_p = (pointer)__return_storage_ptr__;
      original._M_string_length._4_4_ = local_11c;
      original.field_2 =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            )criticalblock7.super_unique_lock;
      Untranslated((bilingual_str *)&local_a0,original);
      std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
      tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                (__return_storage_ptr__,(ChainstateLoadStatus *)&local_108,
                 (bilingual_str *)&local_a0);
      bilingual_str::~bilingual_str((bilingual_str *)&local_a0);
      std::__cxx11::string::~string(local_58);
      goto LAB_001f5f41;
    }
  }
  CompleteChainstateInitialization(&local_a0,chainman,cache_sizes,options);
  if (local_a0.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl == SUCCESS) {
    SVar6 = ChainstateManager::MaybeCompleteSnapshotValidation(chainman);
    if (SVar6 == SUCCESS) {
      logging_function_06._M_str = "LoadChainstate";
      logging_function_06._M_len = 0xe;
      source_file_06._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
      ;
      source_file_06._M_len = 99;
      LogPrintFormatInternal<>
                (logging_function_06,source_file_06,0xd8,ALL,Info,
                 (ConstevalFormatString<0U>)0x68dea4);
      bVar5 = ChainstateManager::ValidatedSnapshotCleanup(chainman);
      if (!bVar5) {
        local_11c = FAILURE_FATAL;
        std::__cxx11::string::string<std::allocator<char>>
                  (local_c0,"Background chainstate cleanup failed unexpectedly.",
                   (allocator<char> *)((long)&uStack_120 + 3));
        original_00._M_string_length._0_4_ = uStack_120;
        original_00._M_dataplus._M_p = (pointer)__return_storage_ptr__;
        original_00._M_string_length._4_4_ = local_11c;
        original_00.field_2 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              )criticalblock7.super_unique_lock;
        Untranslated((bilingual_str *)&local_108,original_00);
        std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
        tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                  (__return_storage_ptr__,&local_11c,(bilingual_str *)&local_108);
        bilingual_str::~bilingual_str((bilingual_str *)&local_108);
        std::__cxx11::string::~string(local_c0);
        goto LAB_001f5f34;
      }
      ChainstateManager::GetAll
                ((vector<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_108,chainman);
      if (local_108.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
          super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>.
          _M_head_impl.original._M_dataplus._M_p !=
          (pointer)local_108.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
                   super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>
                   ._M_head_impl.original._M_string_length) {
        __assert_fail("chainman.GetAll().empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                      ,0xe0,
                      "ChainstateLoadResult node::LoadChainstate(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                     );
      }
      std::_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>::~_Vector_base
                ((_Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_> *)&local_108);
      bVar5 = ChainstateManager::IsSnapshotActive(chainman);
      if (bVar5) {
        __assert_fail("!chainman.IsSnapshotActive()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                      ,0xe1,
                      "ChainstateLoadResult node::LoadChainstate(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                     );
      }
      if ((((chainman->m_snapshot_chainstate)._M_t.
            super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
            super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
            super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl != (Chainstate *)0x0) &&
          (_Var4._M_head_impl =
                (chainman->m_ibd_chainstate)._M_t.
                super___uniq_ptr_impl<Chainstate,_std::default_delete<Chainstate>_>._M_t.
                super__Tuple_impl<0UL,_Chainstate_*,_std::default_delete<Chainstate>_>.
                super__Head_base<0UL,_Chainstate_*,_false>._M_head_impl,
          _Var4._M_head_impl != (Chainstate *)0x0)) && ((_Var4._M_head_impl)->m_disabled == true)) {
        __assert_fail("!chainman.IsSnapshotValidated()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/chainstate.cpp"
                      ,0xe2,
                      "ChainstateLoadResult node::LoadChainstate(ChainstateManager &, const CacheSizes &, const ChainstateLoadOptions &)"
                     );
      }
      ChainstateManager::InitializeChainstate(chainman,options->mempool);
      this_02 = ChainstateManager::ActiveChainstate(chainman);
      Chainstate::ClearBlockIndexCandidates(this_02);
      CompleteChainstateInitialization(&local_108,chainman,cache_sizes,options);
      if (local_108.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
          super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl == SUCCESS) {
        bilingual_str::~bilingual_str((bilingual_str *)&local_108);
        goto LAB_001f5d7a;
      }
      std::_Tuple_impl<0ul,node::ChainstateLoadStatus,bilingual_str>::
      _Tuple_impl<node::ChainstateLoadStatus&,bilingual_str&,void>
                ((_Tuple_impl<0ul,node::ChainstateLoadStatus,bilingual_str> *)__return_storage_ptr__
                 ,&local_108.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
                   super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl,
                 (bilingual_str *)&local_108);
    }
    else if (SVar6 == SKIPPED) {
LAB_001f5d7a:
      local_108.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_dataplus._M_p =
           (pointer)((long)&local_108.
                            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
                            super__Tuple_impl<1UL,_bilingual_str>.
                            super__Head_base<1UL,_bilingual_str,_false>._M_head_impl + 0x10);
      local_108.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original._M_string_length = 0;
      local_108.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .original.field_2._M_local_buf[0] = '\0';
      local_108.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated._M_dataplus._M_p =
           (pointer)((long)&local_108.
                            super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
                            super__Tuple_impl<1UL,_bilingual_str>.
                            super__Head_base<1UL,_bilingual_str,_false>._M_head_impl + 0x30);
      local_108.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated._M_string_length = 0;
      local_108.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
      super__Tuple_impl<1UL,_bilingual_str>.super__Head_base<1UL,_bilingual_str,_false>._M_head_impl
      .translated.field_2._M_local_buf[0] = '\0';
      bilingual_str::bilingual_str
                ((bilingual_str *)__return_storage_ptr__,(bilingual_str *)&local_108);
      (__return_storage_ptr__->super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>).
      super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl = SUCCESS;
    }
    else {
      local_11c = FAILURE;
      _((bilingual_str *)&local_108,(ConstevalStringLiteral)0x68dfec);
      std::tuple<node::ChainstateLoadStatus,_bilingual_str>::
      tuple<node::ChainstateLoadStatus,_bilingual_str,_true>
                (__return_storage_ptr__,&local_11c,(bilingual_str *)&local_108);
    }
    bilingual_str::~bilingual_str((bilingual_str *)&local_108);
  }
  else {
    std::_Tuple_impl<0ul,node::ChainstateLoadStatus,bilingual_str>::
    _Tuple_impl<node::ChainstateLoadStatus&,bilingual_str&,void>
              ((_Tuple_impl<0ul,node::ChainstateLoadStatus,bilingual_str> *)__return_storage_ptr__,
               &local_a0.super__Tuple_impl<0UL,_node::ChainstateLoadStatus,_bilingual_str>.
                super__Head_base<0UL,_node::ChainstateLoadStatus,_false>._M_head_impl,
               (bilingual_str *)&local_a0);
  }
LAB_001f5f34:
  bilingual_str::~bilingual_str((bilingual_str *)&local_a0);
LAB_001f5f41:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock7.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

ChainstateLoadResult LoadChainstate(ChainstateManager& chainman, const CacheSizes& cache_sizes,
                                    const ChainstateLoadOptions& options)
{
    if (!chainman.AssumedValidBlock().IsNull()) {
        LogPrintf("Assuming ancestors of block %s have valid signatures.\n", chainman.AssumedValidBlock().GetHex());
    } else {
        LogPrintf("Validating signatures for all blocks.\n");
    }
    LogPrintf("Setting nMinimumChainWork=%s\n", chainman.MinimumChainWork().GetHex());
    if (chainman.MinimumChainWork() < UintToArith256(chainman.GetConsensus().nMinimumChainWork)) {
        LogPrintf("Warning: nMinimumChainWork set below default value of %s\n", chainman.GetConsensus().nMinimumChainWork.GetHex());
    }
    if (chainman.m_blockman.GetPruneTarget() == BlockManager::PRUNE_TARGET_MANUAL) {
        LogPrintf("Block pruning enabled.  Use RPC call pruneblockchain(height) to manually prune block and undo files.\n");
    } else if (chainman.m_blockman.GetPruneTarget()) {
        LogPrintf("Prune configured to target %u MiB on disk for block and undo files.\n", chainman.m_blockman.GetPruneTarget() / 1024 / 1024);
    }

    LOCK(cs_main);

    chainman.m_total_coinstip_cache = cache_sizes.coins;
    chainman.m_total_coinsdb_cache = cache_sizes.coins_db;

    // Load the fully validated chainstate.
    chainman.InitializeChainstate(options.mempool);

    // Load a chain created from a UTXO snapshot, if any exist.
    bool has_snapshot = chainman.DetectSnapshotChainstate();

    if (has_snapshot && options.wipe_chainstate_db) {
        LogPrintf("[snapshot] deleting snapshot chainstate due to reindexing\n");
        if (!chainman.DeleteSnapshotChainstate()) {
            return {ChainstateLoadStatus::FAILURE_FATAL, Untranslated("Couldn't remove snapshot chainstate.")};
        }
    }

    auto [init_status, init_error] = CompleteChainstateInitialization(chainman, cache_sizes, options);
    if (init_status != ChainstateLoadStatus::SUCCESS) {
        return {init_status, init_error};
    }

    // If a snapshot chainstate was fully validated by a background chainstate during
    // the last run, detect it here and clean up the now-unneeded background
    // chainstate.
    //
    // Why is this cleanup done here (on subsequent restart) and not just when the
    // snapshot is actually validated? Because this entails unusual
    // filesystem operations to move leveldb data directories around, and that seems
    // too risky to do in the middle of normal runtime.
    auto snapshot_completion = chainman.MaybeCompleteSnapshotValidation();

    if (snapshot_completion == SnapshotCompletionResult::SKIPPED) {
        // do nothing; expected case
    } else if (snapshot_completion == SnapshotCompletionResult::SUCCESS) {
        LogPrintf("[snapshot] cleaning up unneeded background chainstate, then reinitializing\n");
        if (!chainman.ValidatedSnapshotCleanup()) {
            return {ChainstateLoadStatus::FAILURE_FATAL, Untranslated("Background chainstate cleanup failed unexpectedly.")};
        }

        // Because ValidatedSnapshotCleanup() has torn down chainstates with
        // ChainstateManager::ResetChainstates(), reinitialize them here without
        // duplicating the blockindex work above.
        assert(chainman.GetAll().empty());
        assert(!chainman.IsSnapshotActive());
        assert(!chainman.IsSnapshotValidated());

        chainman.InitializeChainstate(options.mempool);

        // A reload of the block index is required to recompute setBlockIndexCandidates
        // for the fully validated chainstate.
        chainman.ActiveChainstate().ClearBlockIndexCandidates();

        auto [init_status, init_error] = CompleteChainstateInitialization(chainman, cache_sizes, options);
        if (init_status != ChainstateLoadStatus::SUCCESS) {
            return {init_status, init_error};
        }
    } else {
        return {ChainstateLoadStatus::FAILURE, _(
           "UTXO snapshot failed to validate. "
           "Restart to resume normal initial block download, or try loading a different snapshot.")};
    }

    return {ChainstateLoadStatus::SUCCESS, {}};
}